

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
     ::Destroy(SharedPayloadBase *shared)

{
  if (shared != (SharedPayloadBase *)0x0) {
    std::__cxx11::string::~string((string *)(shared + 2));
  }
  operator_delete(shared,0x30);
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }